

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O1

void __thiscall bloaty::DualMaps::PrintFileMaps(DualMaps *this)

{
  vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> local_28;
  
  FileMaps(&local_28,this);
  PrintMaps(this,&local_28);
  if (local_28.
      super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrintFileMaps() { PrintMaps(FileMaps()); }